

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall TextEntry::draw(TextEntry *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Theme *pTVar12;
  ALLEGRO_FONT *pAVar13;
  ALLEGRO_USTR *pAVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  ulong uVar21;
  uint end;
  undefined8 in_XMM1_Qa;
  undefined8 uVar22;
  undefined8 uVar23;
  int post_cursor;
  UString sub;
  SaveState state;
  undefined4 local_498;
  UString local_470;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined1 local_428 [1024];
  
  pTVar12 = ((this->super_Widget).dialog)->theme;
  al_store_state(local_428,0xffff);
  uVar22._0_4_ = (pTVar12->bg).r;
  uVar22._4_4_ = (pTVar12->bg).g;
  uVar23._0_4_ = (pTVar12->bg).b;
  uVar23._4_4_ = (pTVar12->bg).a;
  iVar15 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar15 != '\0') {
    uVar22 = al_map_rgb(0x40,0x40,0x40);
    uVar23 = in_XMM1_Qa;
  }
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
             (float)(this->super_Widget).x2,(float)(this->super_Widget).y2,uVar22,uVar23);
  al_set_blender(0,1,3);
  if (this->focused == false) {
    pAVar13 = pTVar12->font;
    uVar2 = (pTVar12->fg).r;
    uVar8._0_4_ = (pTVar12->fg).b;
    uVar8._4_4_ = (pTVar12->fg).a;
    iVar15 = (this->super_Widget).x1;
    iVar16 = (this->super_Widget).y1;
    pAVar14 = this->text;
    iVar17 = this->left_pos;
    uVar20 = al_ustr_size(pAVar14);
    local_470.ustr = (ALLEGRO_USTR *)al_ref_ustr(&local_470,pAVar14,iVar17,uVar20);
    al_draw_ustr(uVar2,uVar8,(float)iVar15,(float)iVar16,pAVar13,0,local_470.ustr);
  }
  else {
    iVar15 = (this->super_Widget).x1;
    end = this->cursor_pos;
    if (0 < (int)end) {
      anon_unknown.dwarf_af8a::UString::UString(&local_470,this->text,this->left_pos,end);
      uVar1 = (pTVar12->fg).r;
      uVar5._0_4_ = (pTVar12->fg).b;
      uVar5._4_4_ = (pTVar12->fg).a;
      al_draw_ustr(uVar1,uVar5,(float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
                   pTVar12->font,0,local_470.ustr);
      iVar16 = al_get_ustr_width(pTVar12->font,local_470.ustr);
      iVar15 = iVar16 + iVar15;
      end = this->cursor_pos;
    }
    uVar21 = al_ustr_size(this->text);
    if (uVar21 == end) {
      iVar16 = (this->super_Widget).y1;
      iVar17 = al_get_font_line_height(pTVar12->font);
      uVar6._0_4_ = (pTVar12->fg).r;
      uVar6._4_4_ = (pTVar12->fg).g;
      uVar7._0_4_ = (pTVar12->fg).b;
      uVar7._4_4_ = (pTVar12->fg).a;
      al_draw_filled_rectangle
                ((float)iVar15,(float)iVar16,(float)(iVar15 + 8),(float)(iVar17 + iVar16),uVar6,
                 uVar7);
    }
    else {
      iVar16 = this->cursor_pos;
      al_ustr_next(this->text);
      anon_unknown.dwarf_af8a::UString::UString(&local_470,this->text,this->cursor_pos,iVar16);
      iVar18 = al_get_ustr_width(pTVar12->font,local_470.ustr);
      iVar17 = (this->super_Widget).y1;
      iVar19 = al_get_font_line_height(pTVar12->font);
      uVar9._0_4_ = (pTVar12->fg).r;
      uVar9._4_4_ = (pTVar12->fg).g;
      uVar10._0_4_ = (pTVar12->fg).b;
      uVar10._4_4_ = (pTVar12->fg).a;
      al_draw_filled_rectangle
                ((float)iVar15,(float)iVar17,(float)(iVar18 + iVar15),(float)(iVar19 + iVar17),uVar9
                 ,uVar10);
      uVar3 = (pTVar12->bg).r;
      uVar11._0_4_ = (pTVar12->bg).b;
      uVar11._4_4_ = (pTVar12->bg).a;
      al_draw_ustr(uVar3,uVar11,(float)iVar15,(float)(this->super_Widget).y1,pTVar12->font,0,
                   local_470.ustr);
      pAVar13 = pTVar12->font;
      uVar4 = (pTVar12->fg).r;
      local_458._0_4_ = (pTVar12->fg).b;
      local_458._4_4_ = (pTVar12->fg).a;
      uStack_450 = 0;
      iVar17 = (this->super_Widget).y1;
      pAVar14 = this->text;
      uVar20 = al_ustr_size(pAVar14);
      local_430 = al_ref_ustr(local_440,pAVar14,iVar16,uVar20);
      al_draw_ustr(uVar4,local_458,(float)(iVar18 + iVar15),(float)iVar17,pAVar13,0,local_430);
    }
  }
  al_restore_state(local_428);
  return;
}

Assistant:

void TextEntry::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   if (!focused) {
      al_draw_ustr(theme.font, theme.fg, x1, y1, 0, UString(text, left_pos));
   }
   else {
      int x = x1;

      if (cursor_pos > 0) {
         UString sub(text, left_pos, cursor_pos);
         al_draw_ustr(theme.font, theme.fg, x1, y1, 0, sub);
         x += al_get_ustr_width(theme.font, sub);
      }

      if ((unsigned) cursor_pos == al_ustr_size(text)) {
         al_draw_filled_rectangle(x, y1, x + CURSOR_WIDTH,
            y1 + al_get_font_line_height(theme.font), theme.fg);
      }
      else {
         int post_cursor = cursor_pos;
         al_ustr_next(text, &post_cursor);

         UString sub(text, cursor_pos, post_cursor);
         int subw = al_get_ustr_width(theme.font, sub);
         al_draw_filled_rectangle(x, y1, x + subw,
            y1 + al_get_font_line_height(theme.font), theme.fg);
         al_draw_ustr(theme.font, theme.bg, x, y1, 0, sub);
         x += subw;

         al_draw_ustr(theme.font, theme.fg, x, y1, 0,
            UString(text, post_cursor));
      }
   }
}